

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

ostream * log_info(void)

{
  ostream *poVar1;
  string local_30 [32];
  ostream *local_10;
  
  if ((int)g_log_level < 3) {
    std::ios::clear((int)*(undefined8 *)(g_sink_stringstream_abi_cxx11_ + -0x18) + 0x2a3ed0);
    local_10 = (ostream *)&DAT_002a3ee0;
  }
  else {
    get_time_str_abi_cxx11_();
    poVar1 = std::operator<<((ostream *)&std::cout,local_30);
    local_10 = std::operator<<(poVar1," INFO ");
    std::__cxx11::string::~string(local_30);
  }
  return local_10;
}

Assistant:

std::ostream &log_info()
{
  if (g_log_level >= log_level_info)
  {
    return std::cout << get_time_str() << " INFO ";
  }

  g_sink_stringstream.clear();
  return g_sink_stringstream;
}